

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LogFinish(void)

{
  ImGuiContext *pIVar1;
  int iVar2;
  char *text;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if ((GImGui->LogEnabled & 1U) != 0) {
    LogText("\n");
    if (pIVar1->LogFile != (FILE *)0x0) {
      if (pIVar1->LogFile == _stdout) {
        fflush((FILE *)pIVar1->LogFile);
      }
      else {
        fclose((FILE *)pIVar1->LogFile);
      }
      pIVar1->LogFile = (FILE *)0x0;
    }
    iVar2 = ImGuiTextBuffer::size(&pIVar1->LogClipboard);
    if (1 < iVar2) {
      text = ImGuiTextBuffer::begin(&pIVar1->LogClipboard);
      SetClipboardText(text);
      ImGuiTextBuffer::clear(&pIVar1->LogClipboard);
    }
    pIVar1->LogEnabled = false;
  }
  return;
}

Assistant:

void ImGui::LogFinish()
{
    ImGuiContext& g = *GImGui;
    if (!g.LogEnabled)
        return;

    LogText(IM_NEWLINE);
    if (g.LogFile != NULL)
    {
        if (g.LogFile == stdout)
            fflush(g.LogFile);
        else
            fclose(g.LogFile);
        g.LogFile = NULL;
    }
    if (g.LogClipboard.size() > 1)
    {
        SetClipboardText(g.LogClipboard.begin());
        g.LogClipboard.clear();
    }
    g.LogEnabled = false;
}